

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LatencyDecodingSynapse.cpp
# Opt level: O0

void __thiscall
LatencyDecodingSynapse::LatencyDecodingSynapse
          (LatencyDecodingSynapse *this,Population *n_from,Population *n_to)

{
  vector<Event_*,_std::allocator<Event_*>_> *pvVar1;
  LatencyDecodingSynapse_param *this_00;
  Population *in_RSI;
  Population *in_RDI;
  LatencyDecodingSynapse *unaff_retaddr;
  Population *n_from_00;
  
  n_from_00 = in_RDI;
  Synapse::Synapse((Synapse *)in_RDI);
  in_RDI->_vptr_Population = (_func_int **)&PTR_update_0012bd58;
  pvVar1 = &in_RDI->output;
  this_00 = (LatencyDecodingSynapse_param *)operator_new(0x10);
  LatencyDecodingSynapse_param::LatencyDecodingSynapse_param(this_00);
  (pvVar1->super__Vector_base<Event_*,_std::allocator<Event_*>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this_00;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix((Matrix<double,__1,_1,_0,__1,_1> *)in_RDI);
  std::vector<Event_*,_std::allocator<Event_*>_>::vector
            ((vector<Event_*,_std::allocator<Event_*>_> *)0x11e73a);
  initialize(unaff_retaddr,n_from_00,in_RSI);
  return;
}

Assistant:

LatencyDecodingSynapse::LatencyDecodingSynapse(Population* n_from, Population* n_to) : 
    param(new LatencyDecodingSynapse_param)
{
    initialize(n_from, n_to);
}